

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::parse_multilayer_file(char *metadata_path,MultilayerMetadata *multilayer)

{
  byte bVar1;
  bool bVar2;
  long in_RSI;
  undefined8 in_RDI;
  ifstream file;
  undefined1 local_220 [72];
  MultilayerMetadata *in_stack_fffffffffffffe28;
  MultilayerMetadata *in_stack_fffffffffffffe60;
  ifstream *in_stack_fffffffffffffe68;
  bool local_1;
  
  std::ifstream::ifstream(local_220,in_RDI,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Error: Failed to open %s\n",in_RDI);
    local_1 = false;
  }
  else {
    bVar2 = anon_unknown_0::parse_multilayer_metadata
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    if ((bVar2) &&
       (bVar2 = anon_unknown_0::validate_multilayer_metadata(in_stack_fffffffffffffe28), bVar2)) {
      local_1 = in_RSI != 0;
    }
    else {
      local_1 = false;
    }
  }
  std::ifstream::~ifstream(local_220);
  return local_1;
}

Assistant:

bool parse_multilayer_file(const char *metadata_path,
                           MultilayerMetadata *multilayer) {
  std::ifstream file(metadata_path);
  if (!file.is_open()) {
    fprintf(stderr, "Error: Failed to open %s\n", metadata_path);
    return false;
  }

  if (!parse_multilayer_metadata(file, multilayer) ||
      !validate_multilayer_metadata(*multilayer)) {
    return false;
  }
  return multilayer;
}